

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  CURLcode CVar1;
  uchar *dest;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uchar lastQuantum [3];
  uchar local_3b [3];
  size_t *local_38;
  
  lVar3 = 0;
  *outptr = (uchar *)0x0;
  *outlen = 0;
  do {
    if (src[lVar3] == '\0') {
      uVar5 = 0;
LAB_001042e8:
      CVar1 = CURLE_OK;
      if (3 < lVar3 + uVar5) {
        uVar4 = lVar3 + uVar5 >> 2;
        sVar2 = uVar4 * 3 - uVar5;
        local_38 = outlen;
        dest = (uchar *)(*Curl_cmalloc)(sVar2 + 4);
        if (dest == (uchar *)0x0) {
          CVar1 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *outptr = dest;
          if (uVar4 != 1) {
            lVar3 = uVar4 - 1;
            do {
              decodeQuantum(dest,src);
              dest = dest + 3;
              src = src + 4;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
          decodeQuantum(local_3b,src);
          lVar6 = (uVar5 ^ 3) + (ulong)((uVar5 ^ 3) == 0);
          lVar3 = 0;
          do {
            dest[lVar3] = local_3b[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar6 != lVar3);
          dest[lVar6] = '\0';
          *local_38 = sVar2;
          CVar1 = CURLE_OK;
        }
      }
      return CVar1;
    }
    if (src[lVar3] == '=') {
      uVar5 = (ulong)(src[lVar3 + 1] == '=') + 1;
      goto LAB_001042e8;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t length = 0;
  size_t equalsTerm = 0;
  size_t i;
  size_t numQuantums;
  unsigned char lastQuantum[3];
  size_t rawlen = 0;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;

  while((src[length] != '=') && src[length])
    length++;
  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    equalsTerm++;
    if(src[length+equalsTerm] == '=')
      equalsTerm++;
  }
  numQuantums = (length + equalsTerm) / 4;

  /* Don't allocate a buffer if the decoded length is 0 */
  if(numQuantums == 0)
    return CURLE_OK;

  rawlen = (numQuantums * 3) - equalsTerm;

  /* The buffer must be large enough to make room for the last quantum
  (which may be partially thrown out) and the zero terminator. */
  newstr = malloc(rawlen+4);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  *outptr = newstr;

  /* Decode all but the last quantum (which may not decode to a
  multiple of 3 bytes) */
  for(i = 0; i < numQuantums - 1; i++) {
    decodeQuantum(newstr, src);
    newstr += 3; src += 4;
  }

  /* This final decode may actually read slightly past the end of the buffer
  if the input string is missing pad bytes.  This will almost always be
  harmless. */
  decodeQuantum(lastQuantum, src);
  for(i = 0; i < 3 - equalsTerm; i++)
    newstr[i] = lastQuantum[i];

  newstr[i] = '\0'; /* zero terminate */

  *outlen = rawlen; /* return size of decoded data */

  return CURLE_OK;
}